

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O1

bool __thiscall
ZXing::DataMatrix::EdgeTracer::traceCorner(EdgeTracer *this,PointF dir,PointF *corner)

{
  BitMatrix *pBVar1;
  Value VVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  PointT<double> p;
  PointT<double> p_00;
  uint local_ac;
  PointT<double> local_a8;
  double local_88;
  double dStack_80;
  
  BitMatrixCursor<ZXing::PointT<double>_>::step(&this->super_BitMatrixCursorF,1.0);
  dVar11 = (this->super_BitMatrixCursorF).p.y;
  corner->x = (this->super_BitMatrixCursorF).p.x;
  corner->y = dVar11;
  dVar11 = (this->super_BitMatrixCursorF).d.x;
  dVar12 = (this->super_BitMatrixCursorF).d.y;
  (this->super_BitMatrixCursorF).d.x = dir.x;
  (this->super_BitMatrixCursorF).d.y = dir.y;
  uVar3 = (uint)(ABS(dVar12) < ABS(dVar11));
  auVar15._0_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar15._4_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar15._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar15._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = -dVar11;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = -dVar12;
  auVar16 = ~auVar15 & auVar16 << 0x40 | auVar13 & auVar15;
  iVar4 = 1;
  local_ac = 3;
LAB_00153d71:
  bVar10 = false;
  uVar3 = 1;
LAB_00153d89:
  bVar9 = false;
  uVar8 = 0;
  do {
    uVar6 = (uint)uVar8 + 1;
    uVar5 = -(int)(uVar8 >> 1);
    if ((uVar8 & 1) != 0) {
      uVar5 = uVar6 >> 1;
    }
    local_88 = auVar16._0_8_;
    dStack_80 = auVar16._8_8_;
    local_a8.x = (double)(int)uVar5 * local_88 +
                 (this->super_BitMatrixCursorF).d.x * (double)(int)uVar3 +
                 (this->super_BitMatrixCursorF).p.x;
    local_a8.y = (double)(int)uVar5 * dStack_80 +
                 (this->super_BitMatrixCursorF).d.y * (double)(int)uVar3 +
                 (this->super_BitMatrixCursorF).p.y;
    p.x = local_88 + local_a8.x;
    p.y = dStack_80 + local_a8.y;
    VVar2 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>(&this->super_BitMatrixCursorF,p)
    ;
    if (VVar2.v == 1) {
      iVar7 = 3;
      goto LAB_00153e1a;
    }
    bVar9 = (uint)(iVar4 * 2) <= (uint)uVar8;
    uVar8 = (ulong)uVar6;
  } while (uVar6 != local_ac);
  goto LAB_00153f4a;
  while( true ) {
    local_a8.x = local_a8.x - local_88;
    local_a8.y = local_a8.y - dStack_80;
    p_00.x = local_a8.x - (this->super_BitMatrixCursorF).d.x;
    p_00.y = local_a8.y - (this->super_BitMatrixCursorF).d.y;
    VVar2 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                      (&this->super_BitMatrixCursorF,p_00);
    uVar5 = (uint)(VVar2.v == 1);
    auVar14._0_8_ = CONCAT44((int)(uVar5 << 0x1f) >> 0x1f,(int)(uVar5 << 0x1f) >> 0x1f);
    auVar14._8_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
    auVar14._12_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
    auVar17._0_8_ = (ulong)(local_a8.x - (this->super_BitMatrixCursorF).d.x) & auVar14._0_8_;
    auVar17._8_8_ = (ulong)(local_a8.y - (this->super_BitMatrixCursorF).d.y) & auVar14._8_8_;
    local_a8 = (PointT<double>)(auVar17 | ~auVar14 & (undefined1  [16])local_a8);
    iVar7 = iVar7 + -1;
    if (iVar7 == 0) break;
LAB_00153e1a:
    if ((((local_a8.x < 0.0) ||
         (pBVar1 = (this->super_BitMatrixCursorF).img, (double)pBVar1->_width <= local_a8.x)) ||
        (local_a8.y < 0.0)) || ((double)pBVar1->_height <= local_a8.y)) break;
    VVar2 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                      (&this->super_BitMatrixCursorF,local_a8);
    if (VVar2.v == 0) {
      dVar11 = floor(local_a8.x);
      dVar12 = floor(local_a8.y);
      (this->super_BitMatrixCursorF).p.x = dVar11 + 0.5;
      (this->super_BitMatrixCursorF).p.y = dVar12 + 0.5;
      break;
    }
  }
LAB_00153f4a:
  if (!bVar9) goto LAB_00153f6d;
  bVar10 = 1 < uVar3;
  uVar3 = uVar3 + 1;
  if (uVar3 == 3) goto LAB_00153f6d;
  goto LAB_00153d89;
LAB_00153f6d:
  if (!bVar10) goto LAB_00153f89;
  iVar4 = iVar4 + 1;
  local_ac = local_ac + 2;
  if (iVar4 == 4) {
LAB_00153f89:
    if (0.0 <= corner->x) {
      pBVar1 = (this->super_BitMatrixCursorF).img;
      if ((double)pBVar1->_width <= corner->x) {
        return false;
      }
      if (corner->y < 0.0) {
        return false;
      }
      if ((corner->y < (double)pBVar1->_height) &&
         (dVar11 = (this->super_BitMatrixCursorF).p.x, 0.0 <= dVar11)) {
        if ((double)pBVar1->_width <= dVar11) {
          return false;
        }
        dVar11 = (this->super_BitMatrixCursorF).p.y;
        if (dVar11 < 0.0) {
          return false;
        }
        return dVar11 < (double)pBVar1->_height;
      }
    }
    return false;
  }
  goto LAB_00153d71;
}

Assistant:

bool traceCorner(PointF dir, PointF& corner)
	{
		step();
		log(p);
		corner = p;
		std::swap(d, dir);
		traceStep(-1 * dir, 2, false);
		printf("turn: %.0f x %.0f -> %.2f, %.2f\n", p.x, p.y, d.x, d.y);

		return isIn(corner) && isIn(p);
	}